

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsMan.c
# Opt level: O0

void Mfs_ManClean(Mfs_Man_t *p)

{
  Mfs_Man_t *p_local;
  
  if (p->pAigWin != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pAigWin);
  }
  if (p->pCnf != (Cnf_Dat_t *)0x0) {
    Cnf_DataFree(p->pCnf);
  }
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  if (p->vRoots != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vRoots);
  }
  if (p->vSupp != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vSupp);
  }
  if (p->vNodes != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vNodes);
  }
  if (p->vDivs != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vDivs);
  }
  p->pAigWin = (Aig_Man_t *)0x0;
  p->pCnf = (Cnf_Dat_t *)0x0;
  p->pSat = (sat_solver *)0x0;
  p->vRoots = (Vec_Ptr_t *)0x0;
  p->vSupp = (Vec_Ptr_t *)0x0;
  p->vNodes = (Vec_Ptr_t *)0x0;
  p->vDivs = (Vec_Ptr_t *)0x0;
  return;
}

Assistant:

void Mfs_ManClean( Mfs_Man_t * p )
{
    if ( p->pAigWin )
        Aig_ManStop( p->pAigWin );
    if ( p->pCnf )
        Cnf_DataFree( p->pCnf );
    if ( p->pSat )
        sat_solver_delete( p->pSat );
    if ( p->vRoots )
        Vec_PtrFree( p->vRoots );
    if ( p->vSupp )
        Vec_PtrFree( p->vSupp );
    if ( p->vNodes )
        Vec_PtrFree( p->vNodes );
    if ( p->vDivs )
        Vec_PtrFree( p->vDivs );
    p->pAigWin = NULL;
    p->pCnf    = NULL;
    p->pSat    = NULL;
    p->vRoots  = NULL;
    p->vSupp   = NULL;
    p->vNodes  = NULL;
    p->vDivs   = NULL;
}